

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O1

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  long *plVar5;
  int iVar6;
  undefined1 auVar7 [16];
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  BVH *pBVar13;
  ThreadLocal2 *this_01;
  iterator __position;
  Ref<embree::Geometry> *pRVar14;
  long lVar15;
  RTCFilterFunctionN p_Var16;
  BuildRef *pBVar17;
  MutexSys *pMVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined8 uVar29;
  ThreadLocal2 *this_02;
  ulong uVar30;
  undefined1 (*pauVar31) [16];
  ulong uVar32;
  long lVar33;
  ulong uVar34;
  float *pfVar35;
  long lVar36;
  size_t size;
  ulong uVar37;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar38 [16];
  undefined1 extraout_var [56];
  undefined1 auVar39 [64];
  Lock<embree::MutexSys> lock;
  vuint<4> vgeomID;
  vuint<4> vprimID;
  PrimInfo pinfo;
  MutexSys *local_178;
  char cStack_170;
  undefined7 uStack_16f;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  PrimRef *local_110;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_108;
  char cStack_100;
  undefined7 uStack_ff;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  RefBuilderSmall *local_d8;
  long *local_d0;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  long local_48;
  long local_40;
  
  pGVar12 = (topBuilder->scene->geometries).items[this->objectID_].ptr;
  uVar8 = pGVar12->numPrimitives;
  uVar37 = CONCAT44(0,uVar8);
  lVar33 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_130._0_8_ = lVar33 + 0x550;
  if (lVar33 == 0) {
    local_130._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_130[8] = false;
  local_120 = (undefined1  [16])0x0;
  local_110 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar37 != 0) {
    size = uVar37 << 5;
    (**((MemoryMonitorInterface *)local_130._0_8_)->_vptr_MemoryMonitorInterface)
              (local_130._0_8_,size,0);
    if (uVar8 < 0xe0000) {
      local_110 = (PrimRef *)alignedMalloc(size,0x20);
    }
    else {
      local_110 = (PrimRef *)os_malloc(size,(bool *)(local_130 + 8));
    }
    local_120._8_4_ = uVar8;
    local_120._0_8_ = uVar37;
    local_120._12_4_ = 0;
  }
  avx::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar12,(uint)local_d8->objectID_,uVar37,
             (mvector<PrimRef> *)local_130,
             &(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_02224d38);
    auVar39._8_56_ = extraout_var;
    auVar39._0_8_ = extraout_XMM0_Qa;
    uVar37 = 0;
    do {
      auVar38 = auVar39._0_16_;
      pBVar13 = topBuilder->bvh;
      this_02 = (ThreadLocal2 *)*local_d0;
      if (this_02 == (ThreadLocal2 *)0x0) {
        this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_02);
        (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_02->alloc0).parent = this_02;
        (this_02->alloc0).ptr = (char *)0x0;
        (this_02->alloc0).cur = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).end = 0;
        (this_02->alloc0).allocBlockSize = 0;
        (this_02->alloc0).bytesUsed = 0;
        (this_02->alloc0).bytesWasted = 0;
        (this_02->alloc1).parent = this_02;
        (this_02->alloc1).ptr = (char *)0x0;
        (this_02->alloc1).cur = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).end = 0;
        (this_02->alloc1).allocBlockSize = 0;
        (this_02->alloc1).bytesUsed = 0;
        (this_02->alloc1).bytesWasted = 0;
        *local_d0 = (long)this_02;
        local_178 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
        cStack_170 = '\x01';
        auVar38 = (undefined1  [16])0x0;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108._M_head_impl = this_02;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_108);
        if (local_108._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_108,
                     local_108._M_head_impl);
        }
        if (cStack_170 == '\x01') {
          MutexSys::unlock(local_178);
        }
      }
      this_00 = &pBVar13->alloc;
      uVar32 = (ulong)(((pBVar13->alloc).use_single_mode ^ 1) << 6);
      local_148._0_8_ = 0xb0;
      this_01 = *(ThreadLocal2 **)((long)&(this_02->alloc0).parent + uVar32);
      if (this_00 != (this_01->alloc)._M_b._M_p) {
        cStack_100 = '\x01';
        local_108._M_head_impl = this_01;
        MutexSys::lock(&this_01->mutex);
        if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((this_01->alloc0).end + (this_01->alloc1).end) -
               ((this_01->alloc0).cur + (this_01->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
          UNLOCK();
        }
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).bytesUsed = 0;
        (this_01->alloc0).bytesWasted = 0;
        (this_01->alloc0).ptr = (char *)0x0;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        (this_01->alloc1).ptr = (char *)0x0;
        (this_01->alloc1).cur = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).bytesUsed = 0;
        (this_01->alloc1).bytesWasted = 0;
        (this_01->alloc1).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        LOCK();
        (this_01->alloc)._M_b._M_p = this_00;
        UNLOCK();
        local_178 = (MutexSys *)&FastAllocator::s_thread_local_allocators_lock;
        cStack_170 = '\x01';
        auVar38 = (undefined1  [16])0x0;
        local_c8._M_head_impl = this_01;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar13->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar13->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar13->alloc).thread_local_allocators,__position,&local_c8._M_head_impl)
          ;
        }
        else {
          *__position._M_current = local_c8._M_head_impl;
          pppTVar2 = &(pBVar13->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        if (cStack_170 == '\x01') {
          MutexSys::unlock(local_178);
        }
        if (cStack_100 == '\x01') {
          MutexSys::unlock(&(local_108._M_head_impl)->mutex);
        }
      }
      plVar5 = (long *)((long)&(this_02->alloc0).bytesUsed + uVar32);
      *plVar5 = *plVar5 + local_148._0_8_;
      lVar33 = *(long *)((long)&(this_02->alloc0).cur + uVar32);
      uVar34 = (ulong)(-(int)lVar33 & 0xf);
      uVar30 = lVar33 + local_148._0_8_ + uVar34;
      *(ulong *)((long)&(this_02->alloc0).cur + uVar32) = uVar30;
      if (*(ulong *)((long)&(this_02->alloc0).end + uVar32) < uVar30) {
        *(long *)((long)&(this_02->alloc0).cur + uVar32) = lVar33;
        pMVar18 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar32);
        if (pMVar18 < (MutexSys *)(local_148._0_8_ << 2)) {
          pauVar31 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_148);
        }
        else {
          local_178 = pMVar18;
          pauVar31 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_178);
          *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar32) = pauVar31;
          lVar33 = (*(long *)((long)&(this_02->alloc0).end + uVar32) -
                   *(long *)((long)&(this_02->alloc0).cur + uVar32)) +
                   *(long *)((long)&(this_02->alloc0).bytesWasted + uVar32);
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar32) = lVar33;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = 0;
          *(MutexSys **)((long)&(this_02->alloc0).end + uVar32) = local_178;
          *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = local_148._0_8_;
          if (local_178 < (ulong)local_148._0_8_) {
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = 0;
            local_178 = *(MutexSys **)((long)&(this_02->alloc0).allocBlockSize + uVar32);
            pauVar31 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_178);
            *(undefined1 (**) [16])((long)&(this_02->alloc0).ptr + uVar32) = pauVar31;
            lVar33 = (*(long *)((long)&(this_02->alloc0).end + uVar32) -
                     *(long *)((long)&(this_02->alloc0).cur + uVar32)) +
                     *(long *)((long)&(this_02->alloc0).bytesWasted + uVar32);
            *(long *)((long)&(this_02->alloc0).bytesWasted + uVar32) = lVar33;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = 0;
            *(MutexSys **)((long)&(this_02->alloc0).end + uVar32) = local_178;
            *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = local_148._0_8_;
            if (local_178 < (ulong)local_148._0_8_) {
              *(undefined8 *)((long)&(this_02->alloc0).cur + uVar32) = 0;
              pauVar31 = (undefined1 (*) [16])0x0;
              goto LAB_01487bc9;
            }
          }
          *(long *)((long)&(this_02->alloc0).bytesWasted + uVar32) = lVar33;
        }
      }
      else {
        plVar5 = (long *)((long)&(this_02->alloc0).bytesWasted + uVar32);
        *plVar5 = *plVar5 + uVar34;
        pauVar31 = (undefined1 (*) [16])
                   ((uVar30 - local_148._0_8_) + *(long *)((long)&(this_02->alloc0).ptr + uVar32));
      }
LAB_01487bc9:
      uVar32 = local_40 - local_48;
      local_148 = vpcmpeqd_avx(auVar38,auVar38);
      uStack_158 = 0;
      uStack_150 = 0;
      local_178 = (MutexSys *)0x0;
      cStack_170 = '\0';
      uStack_16f = 0;
      uStack_168 = 0;
      uStack_160 = 0;
      uStack_e8 = 0;
      uStack_e0 = 0;
      local_108._M_head_impl = (ThreadLocal2 *)0x0;
      cStack_100 = '\0';
      uStack_ff = 0;
      uStack_f8 = 0;
      uStack_f0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      local_c8._M_head_impl = (ThreadLocal2 *)0x0;
      uStack_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      local_98 = local_148;
      if (uVar37 < uVar32) {
        pRVar14 = (topBuilder->bvh->scene->geometries).items;
        pfVar35 = local_110[uVar37].upper.field_0.m128 + 3;
        uVar30 = 0;
        do {
          fVar9 = pfVar35[-4];
          fVar10 = *pfVar35;
          pGVar12 = pRVar14[(uint)fVar9].ptr;
          lVar36 = (ulong)(uint)fVar10 *
                   pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar33 = *(long *)&pGVar12->field_0x58;
          lVar15 = *(long *)&pGVar12[1].time_range.upper;
          p_Var16 = pGVar12[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar15 + (ulong)*(uint *)(lVar33 + lVar36) * (long)p_Var16);
          uVar11 = puVar4[1];
          uVar21 = puVar4[2];
          auVar38 = *(undefined1 (*) [16])
                     (lVar15 + (ulong)*(uint *)(lVar33 + 4 + lVar36) * (long)p_Var16);
          auVar7 = *(undefined1 (*) [16])
                    (lVar15 + (ulong)*(uint *)(lVar33 + 8 + lVar36) * (long)p_Var16);
          *(undefined4 *)((long)&local_178 + uVar30 * 4) = *puVar4;
          *(undefined4 *)((long)&uStack_168 + uVar30 * 4) = uVar11;
          *(undefined4 *)((long)&uStack_158 + uVar30 * 4) = uVar21;
          *(int *)((long)&local_108._M_head_impl + uVar30 * 4) = auVar38._0_4_;
          uVar11 = vextractps_avx(auVar38,1);
          *(undefined4 *)((long)&uStack_f8 + uVar30 * 4) = uVar11;
          uVar11 = vextractps_avx(auVar38,2);
          *(undefined4 *)((long)&uStack_e8 + uVar30 * 4) = uVar11;
          *(int *)((long)&local_c8._M_head_impl + uVar30 * 4) = auVar7._0_4_;
          uVar11 = vextractps_avx(auVar7,1);
          *(undefined4 *)((long)&uStack_b8 + uVar30 * 4) = uVar11;
          uVar11 = vextractps_avx(auVar7,2);
          *(undefined4 *)((long)&uStack_a8 + uVar30 * 4) = uVar11;
          *(float *)(local_148 + uVar30 * 4) = fVar9;
          *(float *)(local_98 + uVar30 * 4) = fVar10;
          uVar34 = uVar30 + 1;
          if (2 < uVar30) break;
          lVar33 = uVar30 + uVar37;
          pfVar35 = pfVar35 + 8;
          uVar30 = uVar34;
        } while (lVar33 + 1U < uVar32);
        uVar37 = uVar37 + uVar34;
      }
      auVar38[8] = cStack_170;
      auVar38._0_8_ = local_178;
      auVar38._9_7_ = uStack_16f;
      auVar7._8_8_ = uStack_160;
      auVar7._0_8_ = uStack_168;
      auVar22._8_8_ = uStack_150;
      auVar22._0_8_ = uStack_158;
      auVar23[8] = cStack_100;
      auVar23._0_8_ = local_108._M_head_impl;
      auVar23._9_7_ = uStack_ff;
      auVar24._8_8_ = uStack_f0;
      auVar24._0_8_ = uStack_f8;
      auVar25._8_8_ = uStack_e0;
      auVar25._0_8_ = uStack_e8;
      auVar26._8_8_ = uStack_c0;
      auVar26._0_8_ = local_c8._M_head_impl;
      auVar27._8_8_ = uStack_b0;
      auVar27._0_8_ = uStack_b8;
      auVar28._8_8_ = uStack_a0;
      auVar28._0_8_ = uStack_a8;
      auVar38 = vmovntps_avx(auVar38);
      *pauVar31 = auVar38;
      auVar38 = vmovntps_avx(auVar7);
      pauVar31[1] = auVar38;
      auVar38 = vmovntps_avx(auVar22);
      pauVar31[2] = auVar38;
      auVar38 = vmovntps_avx(auVar23);
      pauVar31[3] = auVar38;
      auVar38 = vmovntps_avx(auVar24);
      pauVar31[4] = auVar38;
      auVar38 = vmovntps_avx(auVar25);
      pauVar31[5] = auVar38;
      auVar38 = vmovntps_avx(auVar26);
      pauVar31[6] = auVar38;
      auVar38 = vmovntps_avx(auVar27);
      pauVar31[7] = auVar38;
      auVar38 = vmovntps_avx(auVar28);
      pauVar31[8] = auVar38;
      auVar38 = vmovntps_avx(local_148);
      pauVar31[9] = auVar38;
      auVar38 = vmovntps_avx(local_98);
      pauVar31[10] = auVar38;
      aVar19.m128 = (__m128)vinsertps_avx(local_88.m128,ZEXT416((uint)local_d8->objectID_),0x30);
      auVar39 = ZEXT1664((undefined1  [16])aVar19);
      aVar20 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_78,ZEXT416(1),0x30);
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar6 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar17 = (topBuilder->refs).items;
      pBVar17[iVar6].super_PrimRef.upper.field_0 = aVar20;
      pBVar17[iVar6].super_PrimRef.lower.field_0 = aVar19;
      pBVar17[iVar6].node.ptr = (ulong)pauVar31 | 9;
      pBVar17[iVar6].bounds_area = 0.0;
    } while (uVar37 < (ulong)(local_40 - local_48));
  }
  uVar29 = local_120._8_8_;
  if (local_110 != (PrimRef *)0x0) {
    if ((ulong)(local_120._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_110);
    }
    else {
      os_free(local_110,local_120._8_8_ << 5,local_130[8]);
    }
  }
  if (uVar29 != 0) {
    (***(_func_int ***)local_130._0_8_)(local_130._0_8_,uVar29 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }